

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<true,_true,_false>::push_block_
          (DaTrie<true,_true,_false> *this,uint32_t block_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  pointer pBVar1;
  uint uVar2;
  
  uVar2 = block_pos * 0x100;
  *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
            super__Vector_impl_data._M_start + (uVar2 + 0xff)) = uVar2 & 0x7fffff00;
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar1[uVar2] =
       (Bc)((ulong)pBVar1[uVar2] & 0x80000000ffffffff | (ulong)(uVar2 + 0xff & 0x7fffffff) << 0x20);
  (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
  super__Vector_impl_data._M_start[block_pos].head = uVar2;
  insert_block_link_(this,block_pos,blocks);
  return;
}

Assistant:

void push_block_(uint32_t block_pos, std::vector<BlockLink>& blocks) {
    auto begin = block_pos * BLOCK_SIZE;
    auto end = begin + BLOCK_SIZE;
    set_next_(end - 1, begin);
    set_prev_(begin, end - 1);

    blocks[block_pos].head = begin;
    insert_block_link_(block_pos, blocks);
  }